

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall QHttp2Stream::handleRST_STREAM(QHttp2Stream *this,Frame *inboundFrame)

{
  uint uVar1;
  uint *puVar2;
  
  if (*(int *)(this + 0x68) == 5) {
    return;
  }
  transitionState(this,RST);
  puVar2 = (uint *)Http2::Frame::dataBegin(inboundFrame);
  uVar1 = *puVar2;
  *(ulong *)(this + 0x20) =
       (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) |
       0x100000000;
  if (*(QObject **)(this + 0x38) != (QObject *)0x0) {
    QObject::disconnect(*(QObject **)(this + 0x38),(char *)0x0,(QObject *)this,(char *)0x0);
    *(undefined8 *)(this + 0x30) = 0;
    *(undefined8 *)(this + 0x38) = 0;
    if (((byte)this[0x24] & 1) == 0) {
      handleRST_STREAM();
    }
  }
  finishWithError(this,*(Http2Error *)(this + 0x20));
  return;
}

Assistant:

void QHttp2Stream::handleRST_STREAM(const Frame &inboundFrame)
{
    if (m_state == State::Closed) // The stream is already closed, we're not sending anything anyway
        return;

    transitionState(StateTransition::RST);
    m_RST_STREAM_received = qFromBigEndian<quint32>(inboundFrame.dataBegin());
    if (isUploadingDATA()) {
        disconnect(m_uploadByteDevice, nullptr, this, nullptr);
        m_uploadDevice = nullptr;
        m_uploadByteDevice = nullptr;
    }
    finishWithError(Http2Error(*m_RST_STREAM_received));
}